

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

TimeZone * __thiscall
icu_63::TimeZoneFormat::parse
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,UnicodeString *text,ParsePosition *pos,
          int32_t parseOptions,UTimeZoneFormatTimeType *timeType)

{
  UBool UVar1;
  uint newIndex;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  UTimeZoneFormatTimeType UVar5;
  int32_t iVar6;
  int iVar7;
  UTimeZoneNameType UVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MatchInfoCollection *pMVar9;
  TimeZoneGenericNames *pTVar10;
  bool bVar11;
  bool local_24a;
  TimeZoneFormat *local_240;
  TimeZone *parsedTZ;
  TimeZoneGenericNames *gnames_1;
  int32_t local_228;
  UTimeZoneFormatTimeType tt_1;
  int32_t genMatchLen;
  int32_t i_3;
  int32_t matchPos_3;
  int32_t tzdbNameMatchIdx;
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> tzdbNameMatches_1;
  TZDBTimeZoneNames *tzdbTimeZoneNames_1;
  int local_200;
  int32_t i_2;
  int32_t matchPos_2;
  int32_t specificMatchIdx;
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> specificMatches_1;
  undefined1 local_1e8;
  UBool hasDigitOffset_4;
  UBool hasDigitOffset_3;
  UBool hasDigitOffset_2;
  UTimeZoneFormatTimeType parsedTimeType;
  UnicodeString parsedID;
  UChar parsedIDBuf [32];
  TimeZoneGenericNames *gnames;
  UTimeZoneFormatTimeType tt;
  int32_t len;
  int32_t genericNameTypes;
  int32_t i_1;
  int32_t matchPos_1;
  int32_t matchIdx_1;
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> tzdbNameMatches;
  TZDBTimeZoneNames *tzdbTimeZoneNames;
  int32_t local_130;
  int32_t i;
  int32_t matchPos;
  int32_t matchIdx;
  LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> specificMatches;
  int32_t nameTypes;
  UBool hasDigitOffset_1;
  UBool parseTZDBAbbrev;
  UnicodeString tzID;
  UChar tzIDBuf [32];
  UErrorCode local_8c;
  int local_88;
  UErrorCode status;
  UBool local_71;
  int32_t local_70;
  int32_t iStack_6c;
  UBool hasDigitOffset;
  int32_t parsedPos;
  int32_t parsedOffset;
  ParsePosition tmpPos;
  int32_t evaluated;
  UBool fallbackShortLocalizedGMT;
  UBool fallbackLocalizedGMT;
  int32_t offset;
  int32_t maxPos;
  int32_t startIdx;
  UTimeZoneFormatTimeType *timeType_local;
  int32_t parseOptions_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  UTimeZoneFormatStyle style_local;
  TimeZoneFormat *this_local;
  
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  newIndex = ParsePosition::getIndex(pos);
  iVar2 = UnicodeString::length(text);
  bVar11 = true;
  if ((style != UTZFMT_STYLE_SPECIFIC_LONG) && (bVar11 = true, style != UTZFMT_STYLE_GENERIC_LONG))
  {
    bVar11 = style == UTZFMT_STYLE_GENERIC_LOCATION;
  }
  local_24a = style == UTZFMT_STYLE_SPECIFIC_SHORT || style == UTZFMT_STYLE_GENERIC_SHORT;
  tmpPos.errorIndex = 0;
  ParsePosition::ParsePosition((ParsePosition *)&parsedPos,newIndex);
  iStack_6c = 0x7fffffff;
  local_70 = -1;
  if ((bVar11) || (style == UTZFMT_STYLE_SPECIFIC_SHORT || style == UTZFMT_STYLE_GENERIC_SHORT)) {
    local_71 = '\0';
    iVar3 = parseOffsetLocalizedGMT(this,text,(ParsePosition *)&parsedPos,local_24a,&local_71);
    iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar4 == -1) {
      iVar4 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
      if ((iVar4 == iVar2) || (local_71 != '\0')) {
        iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
        ParsePosition::setIndex(pos,iVar2);
        this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
        local_88 = 1;
        goto LAB_0023a374;
      }
      iStack_6c = iVar3;
      local_70 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    }
    tmpPos.errorIndex = tmpPos.errorIndex | 0x60;
  }
  local_8c = U_ZERO_ERROR;
  UnicodeString::UnicodeString
            ((UnicodeString *)&nameTypes,tzID.fUnion.fStackFields.fBuffer + 0x17,0,0x20);
  specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._7_1_ =
       (char)((parseOptions & 2U) >> 1);
  switch(style) {
  case UTZFMT_STYLE_GENERIC_LOCATION:
  case UTZFMT_STYLE_GENERIC_LONG:
  case UTZFMT_STYLE_GENERIC_SHORT:
    tt = UTZFMT_TIME_TYPE_UNKNOWN;
    if (style == UTZFMT_STYLE_GENERIC_LOCATION) {
      tt = UTZFMT_TIME_TYPE_STANDARD;
    }
    else if (style == UTZFMT_STYLE_GENERIC_LONG) {
      tt = UTZFMT_TIME_TYPE_DAYLIGHT|UTZFMT_TIME_TYPE_STANDARD;
    }
    else if (style == UTZFMT_STYLE_GENERIC_SHORT) {
      tt = 5;
    }
    gnames._4_4_ = 0;
    gnames._0_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
    pTVar10 = getTimeZoneGenericNames(this,&local_8c);
    UVar1 = ::U_SUCCESS(local_8c);
    if (UVar1 != '\0') {
      gnames._4_4_ = TimeZoneGenericNames::findBestMatch
                               (pTVar10,text,newIndex,tt,(UnicodeString *)&nameTypes,
                                (UTimeZoneFormatTimeType *)&gnames,&local_8c);
    }
    UVar1 = ::U_FAILURE(local_8c);
    if (UVar1 == '\0') {
      if (gnames._4_4_ < 1) goto switchD_00238777_default;
      if (timeType != (UTimeZoneFormatTimeType *)0x0) {
        *timeType = (UTimeZoneFormatTimeType)gnames;
      }
      ParsePosition::setIndex(pos,newIndex + gnames._4_4_);
      this_local = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&nameTypes);
      local_88 = 1;
    }
    else {
      ParsePosition::setErrorIndex(pos,newIndex);
      this_local = (TimeZoneFormat *)0x0;
      local_88 = 1;
    }
    break;
  case UTZFMT_STYLE_SPECIFIC_LONG:
  case UTZFMT_STYLE_SPECIFIC_SHORT:
    if (style == UTZFMT_STYLE_SPECIFIC_LONG) {
      specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._0_4_ =
           6;
    }
    else {
      specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._0_4_ =
           0x30;
    }
    iVar7 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                      (this->fTimeZoneNames,text,(ulong)newIndex,
                       (ulong)(uint)specificMatches.
                                    super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                    .ptr,&local_8c);
    LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::LocalPointer
              ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos,
               (MatchInfoCollection *)CONCAT44(extraout_var,iVar7));
    UVar1 = ::U_FAILURE(local_8c);
    if (UVar1 == '\0') {
      UVar1 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::isNull
                        ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos);
      if (UVar1 == '\0') {
        i = -1;
        local_130 = -1;
        tzdbTimeZoneNames._4_4_ = 0;
        while( true ) {
          pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                             ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                              &matchPos);
          iVar3 = TimeZoneNames::MatchInfoCollection::size(pMVar9);
          if (iVar3 <= tzdbTimeZoneNames._4_4_) break;
          pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                             ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                              &matchPos);
          iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                            (pMVar9,tzdbTimeZoneNames._4_4_);
          local_130 = newIndex + iVar3;
          if (local_70 < local_130) {
            i = tzdbTimeZoneNames._4_4_;
            local_70 = local_130;
          }
          tzdbTimeZoneNames._4_4_ = tzdbTimeZoneNames._4_4_ + 1;
        }
        if (-1 < i) {
          if (timeType != (UTimeZoneFormatTimeType *)0x0) {
            pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                               ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                &matchPos);
            UVar8 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(pMVar9,i);
            UVar5 = getTimeType(UVar8);
            *timeType = UVar5;
          }
          ParsePosition::setIndex(pos,local_130);
          pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::getAlias
                             ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                              &matchPos);
          getTimeZoneID(this,pMVar9,i,(UnicodeString *)&nameTypes);
          this_local = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&nameTypes);
          local_88 = 1;
          goto LAB_00239072;
        }
      }
      if ((specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr.
           _7_1_ != '\0') && (style == UTZFMT_STYLE_SPECIFIC_SHORT)) {
        tzdbNameMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr =
             (LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>)
             getTZDBTimeZoneNames(this,&local_8c);
        UVar1 = ::U_SUCCESS(local_8c);
        if (UVar1 != '\0') {
          pMVar9 = (MatchInfoCollection *)
                   (**(code **)(*(long *)tzdbNameMatches.
                                         super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                         .ptr + 0x78))
                             (tzdbNameMatches.
                              super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr
                              ,text,newIndex,
                              (uint)specificMatches.
                                    super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                    .ptr,&local_8c);
          LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::LocalPointer
                    ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos_1,pMVar9)
          ;
          UVar1 = ::U_FAILURE(local_8c);
          if (UVar1 == '\0') {
            UVar1 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::isNull
                              ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                               &matchPos_1);
            if (UVar1 == '\0') {
              i_1 = -1;
              genericNameTypes = -1;
              len = 0;
              while( true ) {
                iVar3 = len;
                pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                   ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                    &matchPos_1);
                iVar4 = TimeZoneNames::MatchInfoCollection::size(pMVar9);
                if (iVar4 <= iVar3) break;
                pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                   ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                    &matchPos_1);
                iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(pMVar9,len);
                genericNameTypes = newIndex + iVar3;
                if (local_70 < genericNameTypes) {
                  i_1 = len;
                  local_70 = genericNameTypes;
                }
                len = len + 1;
              }
              if (-1 < i_1) {
                if (timeType != (UTimeZoneFormatTimeType *)0x0) {
                  pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                     ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                       *)&matchPos_1);
                  UVar8 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(pMVar9,i_1);
                  UVar5 = getTimeType(UVar8);
                  *timeType = UVar5;
                }
                ParsePosition::setIndex(pos,genericNameTypes);
                pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::getAlias
                                   ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                    &matchPos_1);
                getTimeZoneID(this,pMVar9,i_1,(UnicodeString *)&nameTypes);
                this_local = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&nameTypes)
                ;
                local_88 = 1;
                goto LAB_00239052;
              }
            }
            local_88 = 0;
          }
          else {
            ParsePosition::setErrorIndex(pos,newIndex);
            this_local = (TimeZoneFormat *)0x0;
            local_88 = 1;
          }
LAB_00239052:
          LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::~LocalPointer
                    ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos_1);
          if (local_88 != 0) goto LAB_00239072;
        }
      }
      local_88 = 2;
    }
    else {
      ParsePosition::setErrorIndex(pos,newIndex);
      this_local = (TimeZoneFormat *)0x0;
      local_88 = 1;
    }
LAB_00239072:
    LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::~LocalPointer
              ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos);
    if (local_88 == 2) goto switchD_00238777_default;
    break;
  case UTZFMT_STYLE_LOCALIZED_GMT:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    iVar3 = parseOffsetLocalizedGMT(this,text,(ParsePosition *)&parsedPos);
    iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar4 != -1) {
      tmpPos.errorIndex = tmpPos.errorIndex | 0x40;
      goto switchD_00238777_default;
    }
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
    local_88 = 1;
    break;
  case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    iVar3 = parseOffsetShortLocalizedGMT(this,text,(ParsePosition *)&parsedPos);
    iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar4 != -1) {
      tmpPos.errorIndex = tmpPos.errorIndex | 0x20;
      goto switchD_00238777_default;
    }
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
    local_88 = 1;
    break;
  case UTZFMT_STYLE_ISO_BASIC_SHORT:
  case UTZFMT_STYLE_ISO_BASIC_FIXED:
  case UTZFMT_STYLE_ISO_BASIC_FULL:
  case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
  case UTZFMT_STYLE_ISO_EXTENDED_FULL:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    iVar3 = parseOffsetISO8601(this,text,(ParsePosition *)&parsedPos);
    iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar4 != -1) goto switchD_00238777_default;
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
    local_88 = 1;
    break;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._6_1_ =
         '\0';
    iVar3 = parseOffsetISO8601(this,text,(ParsePosition *)&parsedPos,'\0',
                               (UBool *)((long)&specificMatches.
                                                super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                                .ptr + 6));
    iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if ((iVar4 != -1) ||
       (specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._6_1_
        == '\0')) goto switchD_00238777_default;
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
    local_88 = 1;
    break;
  case UTZFMT_STYLE_ZONE_ID:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    parseZoneID(this,text,(ParsePosition *)&parsedPos,(UnicodeString *)&nameTypes);
    iVar3 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar3 != -1) goto switchD_00238777_default;
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&nameTypes);
    local_88 = 1;
    break;
  case UTZFMT_STYLE_ZONE_ID_SHORT:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    parseShortZoneID(this,text,(ParsePosition *)&parsedPos,(UnicodeString *)&nameTypes);
    iVar3 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar3 != -1) goto switchD_00238777_default;
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&nameTypes);
    local_88 = 1;
    break;
  case UTZFMT_STYLE_EXEMPLAR_LOCATION:
    ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
    ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
    parseExemplarLocation(this,text,(ParsePosition *)&parsedPos,(UnicodeString *)&nameTypes);
    iVar3 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
    if (iVar3 != -1) goto switchD_00238777_default;
    iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
    ParsePosition::setIndex(pos,iVar2);
    this_local = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&nameTypes);
    local_88 = 1;
    break;
  default:
switchD_00238777_default:
    tmpPos.errorIndex = *(short *)(STYLE_PARSE_FLAGS + (ulong)style * 2) | tmpPos.errorIndex;
    if ((int)newIndex < local_70) {
      ParsePosition::setIndex(pos,local_70);
      this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iStack_6c);
      local_88 = 1;
    }
    else {
      UnicodeString::UnicodeString
                ((UnicodeString *)&local_1e8,parsedID.fUnion.fStackFields.fBuffer + 0x17,0,0x20);
      specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._4_4_
           = UTZFMT_TIME_TYPE_UNKNOWN;
      if ((local_70 < iVar2) &&
         (((tmpPos.errorIndex & 0x80U) == 0 || ((tmpPos.errorIndex & 0x100U) == 0)))) {
        ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
        ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
        specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr.
        _3_1_ = '\0';
        iVar3 = parseOffsetISO8601(this,text,(ParsePosition *)&parsedPos,'\0',
                                   (UBool *)((long)&specificMatches_1.
                                                                                                        
                                                  super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                                  .ptr + 3));
        iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
        if (iVar4 != -1) goto LAB_0023967c;
        iVar6 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
        iVar4 = local_70;
        if ((iVar6 != iVar2) &&
           (specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr
            ._3_1_ == '\0')) {
          iVar6 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
          if (iVar4 < iVar6) {
            iStack_6c = iVar3;
            UnicodeString::setToBogus((UnicodeString *)&local_1e8);
            specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr
            ._4_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
            local_70 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
          }
          goto LAB_0023967c;
        }
        iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
        ParsePosition::setIndex(pos,iVar2);
        this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
        local_88 = 1;
      }
      else {
LAB_0023967c:
        if ((local_70 < iVar2) && ((tmpPos.errorIndex & 0x20U) == 0)) {
          ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
          ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
          specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr.
          _2_1_ = '\0';
          iVar3 = parseOffsetLocalizedGMT
                            (this,text,(ParsePosition *)&parsedPos,'\0',
                             (UBool *)((long)&specificMatches_1.
                                              super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                              .ptr + 2));
          iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
          if (iVar4 == -1) {
            iVar6 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
            iVar4 = local_70;
            if ((iVar6 == iVar2) ||
               (specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                .ptr._2_1_ != '\0')) {
              iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
              ParsePosition::setIndex(pos,iVar2);
              this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
              local_88 = 1;
              goto LAB_0023a33c;
            }
            iVar6 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
            if (iVar4 < iVar6) {
              iStack_6c = iVar3;
              UnicodeString::setToBogus((UnicodeString *)&local_1e8);
              specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.
              ptr._4_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
              local_70 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
            }
          }
        }
        if ((local_70 < iVar2) && ((tmpPos.errorIndex & 0x40U) == 0)) {
          ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
          ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
          specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr.
          _1_1_ = '\0';
          iVar3 = parseOffsetLocalizedGMT
                            (this,text,(ParsePosition *)&parsedPos,'\x01',
                             (UBool *)((long)&specificMatches_1.
                                              super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                              .ptr + 1));
          iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
          if (iVar4 == -1) {
            iVar6 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
            iVar4 = local_70;
            if ((iVar6 == iVar2) ||
               (specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                .ptr._1_1_ != '\0')) {
              iVar2 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
              ParsePosition::setIndex(pos,iVar2);
              this_local = (TimeZoneFormat *)createTimeZoneForOffset(this,iVar3);
              local_88 = 1;
              goto LAB_0023a33c;
            }
            iVar6 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
            if (iVar4 < iVar6) {
              iStack_6c = iVar3;
              UnicodeString::setToBogus((UnicodeString *)&local_1e8);
              specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.
              ptr._4_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
              local_70 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
            }
          }
        }
        if ((parseOptions & 1U) != 0) {
          if (local_70 < iVar2) {
            iVar7 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                              (this->fTimeZoneNames,text,(ulong)newIndex,0x76,&local_8c);
            LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::LocalPointer
                      ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos_2,
                       (MatchInfoCollection *)CONCAT44(extraout_var_00,iVar7));
            UVar1 = ::U_FAILURE(local_8c);
            if (UVar1 == '\0') {
              i_2 = -1;
              local_200 = -1;
              UVar1 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::isNull
                                ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                 &matchPos_2);
              if (UVar1 == '\0') {
                tzdbTimeZoneNames_1._4_4_ = 0;
                while( true ) {
                  pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                     ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                       *)&matchPos_2);
                  iVar3 = TimeZoneNames::MatchInfoCollection::size(pMVar9);
                  if (iVar3 <= tzdbTimeZoneNames_1._4_4_) break;
                  pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                     ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                       *)&matchPos_2);
                  iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                    (pMVar9,tzdbTimeZoneNames_1._4_4_);
                  if (local_200 < (int)(newIndex + iVar3)) {
                    i_2 = tzdbTimeZoneNames_1._4_4_;
                    pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::
                             operator->((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                         *)&matchPos_2);
                    iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                      (pMVar9,tzdbTimeZoneNames_1._4_4_);
                    local_200 = newIndex + iVar3;
                  }
                  tzdbTimeZoneNames_1._4_4_ = tzdbTimeZoneNames_1._4_4_ + 1;
                }
              }
              if (local_70 < local_200) {
                local_70 = local_200;
                pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::getAlias
                                   ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                    &matchPos_2);
                getTimeZoneID(this,pMVar9,i_2,(UnicodeString *)&local_1e8);
                pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                   ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                    &matchPos_2);
                UVar8 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(pMVar9,i_2);
                specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                .ptr._4_4_ = getTimeType(UVar8);
                iStack_6c = 0x7fffffff;
              }
              local_88 = 0;
            }
            else {
              ParsePosition::setErrorIndex(pos,newIndex);
              this_local = (TimeZoneFormat *)0x0;
              local_88 = 1;
            }
            LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::~LocalPointer
                      ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos_2);
            if (local_88 != 0) goto LAB_0023a33c;
          }
          if (((specificMatches.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.
                ptr._7_1_ != '\0') && (local_70 < iVar2)) && ((tmpPos.errorIndex & 0x10U) == 0)) {
            tzdbNameMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr
                 = (LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>)
                   getTZDBTimeZoneNames(this,&local_8c);
            UVar1 = ::U_SUCCESS(local_8c);
            if (UVar1 != '\0') {
              pMVar9 = (MatchInfoCollection *)
                       (**(code **)(*(long *)tzdbNameMatches_1.
                                             super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                             .ptr + 0x78))
                                 (tzdbNameMatches_1.
                                  super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                  .ptr,text,newIndex,0x76,&local_8c);
              LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::LocalPointer
                        ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos_3,
                         pMVar9);
              UVar1 = ::U_FAILURE(local_8c);
              if (UVar1 == '\0') {
                i_3 = -1;
                genMatchLen = -1;
                UVar1 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::isNull
                                  ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection> *)
                                   &matchPos_3);
                if (UVar1 == '\0') {
                  tt_1 = UTZFMT_TIME_TYPE_UNKNOWN;
                  while( true ) {
                    UVar5 = tt_1;
                    pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::
                             operator->((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                         *)&matchPos_3);
                    iVar3 = TimeZoneNames::MatchInfoCollection::size(pMVar9);
                    if (iVar3 <= (int)UVar5) break;
                    pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::
                             operator->((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                         *)&matchPos_3);
                    iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(pMVar9,tt_1);
                    if (genMatchLen < (int)(newIndex + iVar3)) {
                      i_3 = tt_1;
                      pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::
                               operator->((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                           *)&matchPos_3);
                      iVar3 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(pMVar9,tt_1);
                      genMatchLen = newIndex + iVar3;
                    }
                    tt_1 = tt_1 + UTZFMT_TIME_TYPE_STANDARD;
                  }
                }
                if (local_70 < genMatchLen) {
                  local_70 = genMatchLen;
                  pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::getAlias
                                     ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                       *)&matchPos_3);
                  getTimeZoneID(this,pMVar9,i_3,(UnicodeString *)&local_1e8);
                  pMVar9 = LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>::operator->
                                     ((LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>
                                       *)&matchPos_3);
                  UVar8 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(pMVar9,i_3);
                  specificMatches_1.
                  super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._4_4_ =
                       getTimeType(UVar8);
                  iStack_6c = 0x7fffffff;
                }
                local_88 = 0;
              }
              else {
                ParsePosition::setErrorIndex(pos,newIndex);
                this_local = (TimeZoneFormat *)0x0;
                local_88 = 1;
              }
              LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection>::~LocalPointer
                        ((LocalPointer<icu_63::TimeZoneNames::MatchInfoCollection> *)&matchPos_3);
              if (local_88 != 0) goto LAB_0023a33c;
            }
          }
          if (local_70 < iVar2) {
            local_228 = -1;
            gnames_1._4_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
            pTVar10 = getTimeZoneGenericNames(this,&local_8c);
            UVar1 = ::U_SUCCESS(local_8c);
            if (UVar1 != '\0') {
              local_228 = TimeZoneGenericNames::findBestMatch
                                    (pTVar10,text,newIndex,7,(UnicodeString *)&nameTypes,
                                     (UTimeZoneFormatTimeType *)((long)&gnames_1 + 4),&local_8c);
            }
            UVar1 = ::U_FAILURE(local_8c);
            if (UVar1 != '\0') {
              ParsePosition::setErrorIndex(pos,newIndex);
              this_local = (TimeZoneFormat *)0x0;
              local_88 = 1;
              goto LAB_0023a33c;
            }
            if ((0 < local_228) && (local_70 < (int)(newIndex + local_228))) {
              local_70 = newIndex + local_228;
              UnicodeString::setTo((UnicodeString *)&local_1e8,(UnicodeString *)&nameTypes);
              specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.
              ptr._4_4_ = gnames_1._4_4_;
              iStack_6c = 0x7fffffff;
            }
          }
          if ((local_70 < iVar2) && ((tmpPos.errorIndex & 0x200U) == 0)) {
            ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
            ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
            parseZoneID(this,text,(ParsePosition *)&parsedPos,(UnicodeString *)&nameTypes);
            iVar4 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
            iVar3 = local_70;
            if ((iVar4 == -1) &&
               (iVar4 = ParsePosition::getIndex((ParsePosition *)&parsedPos), iVar3 < iVar4)) {
              local_70 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
              UnicodeString::setTo((UnicodeString *)&local_1e8,(UnicodeString *)&nameTypes);
              specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.
              ptr._4_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
              iStack_6c = 0x7fffffff;
            }
          }
          if ((local_70 < iVar2) && ((tmpPos.errorIndex & 0x200U) == 0)) {
            ParsePosition::setIndex((ParsePosition *)&parsedPos,newIndex);
            ParsePosition::setErrorIndex((ParsePosition *)&parsedPos,-1);
            parseShortZoneID(this,text,(ParsePosition *)&parsedPos,(UnicodeString *)&nameTypes);
            iVar3 = ParsePosition::getErrorIndex((ParsePosition *)&parsedPos);
            iVar2 = local_70;
            if ((iVar3 == -1) &&
               (iVar3 = ParsePosition::getIndex((ParsePosition *)&parsedPos), iVar2 < iVar3)) {
              local_70 = ParsePosition::getIndex((ParsePosition *)&parsedPos);
              UnicodeString::setTo((UnicodeString *)&local_1e8,(UnicodeString *)&nameTypes);
              specificMatches_1.super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.
              ptr._4_4_ = UTZFMT_TIME_TYPE_UNKNOWN;
              iStack_6c = 0x7fffffff;
            }
          }
        }
        if ((int)newIndex < local_70) {
          iVar2 = UnicodeString::length((UnicodeString *)&local_1e8);
          if (iVar2 < 1) {
            local_240 = (TimeZoneFormat *)createTimeZoneForOffset(this,iStack_6c);
          }
          else {
            local_240 = (TimeZoneFormat *)TimeZone::createTimeZone((UnicodeString *)&local_1e8);
          }
          if (timeType != (UTimeZoneFormatTimeType *)0x0) {
            *timeType = specificMatches_1.
                        super_LocalPointerBase<icu_63::TimeZoneNames::MatchInfoCollection>.ptr._4_4_
            ;
          }
          ParsePosition::setIndex(pos,local_70);
          this_local = local_240;
          local_88 = 1;
        }
        else {
          ParsePosition::setErrorIndex(pos,newIndex);
          this_local = (TimeZoneFormat *)0x0;
          local_88 = 1;
        }
      }
LAB_0023a33c:
      UnicodeString::~UnicodeString((UnicodeString *)&local_1e8);
    }
  }
  UnicodeString::~UnicodeString((UnicodeString *)&nameTypes);
LAB_0023a374:
  ParsePosition::~ParsePosition((ParsePosition *)&parsedPos);
  return (TimeZone *)this_local;
}

Assistant:

TimeZone*
TimeZoneFormat::parse(UTimeZoneFormatStyle style, const UnicodeString& text, ParsePosition& pos,
        int32_t parseOptions, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    int32_t startIdx = pos.getIndex();
    int32_t maxPos = text.length();
    int32_t offset;

    // Styles using localized GMT format as fallback
    UBool fallbackLocalizedGMT = 
        (style == UTZFMT_STYLE_SPECIFIC_LONG || style == UTZFMT_STYLE_GENERIC_LONG || style == UTZFMT_STYLE_GENERIC_LOCATION);
    UBool fallbackShortLocalizedGMT =
        (style == UTZFMT_STYLE_SPECIFIC_SHORT || style == UTZFMT_STYLE_GENERIC_SHORT);

    int32_t evaluated = 0;  // bit flags representing already evaluated styles
    ParsePosition tmpPos(startIdx);

    int32_t parsedOffset = UNKNOWN_OFFSET;  // stores successfully parsed offset for later use
    int32_t parsedPos = -1;                 // stores successfully parsed offset position for later use

    // Try localized GMT format first if necessary
    if (fallbackLocalizedGMT || fallbackShortLocalizedGMT) {
        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, fallbackShortLocalizedGMT, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            // Even when the input text was successfully parsed as a localized GMT format text,
            // we may still need to evaluate the specified style if -
            //   1) GMT zero format was used, and
            //   2) The input text was not completely processed
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            parsedOffset = offset;
            parsedPos = tmpPos.getIndex();
        }
        // Note: For now, no distinction between long/short localized GMT format in the parser.
        // This might be changed in future.
        // evaluated |= (fallbackLocalizedGMT ? STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] : STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]);
        evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] | STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];
    }

    UErrorCode status = U_ZERO_ERROR;
    UChar tzIDBuf[32];
    UnicodeString tzID(tzIDBuf, 0, UPRV_LENGTHOF(tzIDBuf));

    UBool parseTZDBAbbrev = ((parseOptions & UTZFMT_PARSE_OPTION_TZ_DATABASE_ABBREVIATIONS) != 0);

    // Try the specified style
    switch (style) {
    case UTZFMT_STYLE_LOCALIZED_GMT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];

            break;
        }
    case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetShortLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT];

            break;
        }
    case UTZFMT_STYLE_ISO_BASIC_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetISO8601(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            // Exclude the case of UTC Indicator "Z" here
            UBool hasDigitOffset = FALSE;
            offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
            if (tmpPos.getErrorIndex() == -1 && hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_SPECIFIC_LONG:
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        {
            // Specific styles
            int32_t nameTypes = 0;
            if (style == UTZFMT_STYLE_SPECIFIC_LONG) {
                nameTypes = (UTZNM_LONG_STANDARD | UTZNM_LONG_DAYLIGHT);
            } else {
                U_ASSERT(style == UTZFMT_STYLE_SPECIFIC_SHORT);
                nameTypes = (UTZNM_SHORT_STANDARD | UTZNM_SHORT_DAYLIGHT);
            }
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, nameTypes, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (!specificMatches.isNull()) {
                int32_t matchIdx = -1;
                int32_t matchPos = -1;
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    matchPos  = startIdx + specificMatches->getMatchLengthAt(i);
                    if (matchPos > parsedPos) {
                        matchIdx = i;
                        parsedPos = matchPos;
                    }
                }
                if (matchIdx >= 0) {
                    if (timeType) {
                        *timeType = getTimeType(specificMatches->getNameTypeAt(matchIdx));
                    }
                    pos.setIndex(matchPos);
                    getTimeZoneID(specificMatches.getAlias(), matchIdx, tzID);
                    U_ASSERT(!tzID.isEmpty());
                    return TimeZone::createTimeZone(tzID);
                }
            }

            if (parseTZDBAbbrev && style == UTZFMT_STYLE_SPECIFIC_SHORT) {
                U_ASSERT((nameTypes & UTZNM_SHORT_STANDARD) != 0);
                U_ASSERT((nameTypes & UTZNM_SHORT_DAYLIGHT) != 0);

                const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
                if (U_SUCCESS(status)) {
                    LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                        tzdbTimeZoneNames->find(text, startIdx, nameTypes, status));
                    if (U_FAILURE(status)) {
                        pos.setErrorIndex(startIdx);
                        return NULL;
                    }
                    if (!tzdbNameMatches.isNull()) {
                        int32_t matchIdx = -1;
                        int32_t matchPos = -1;
                        for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                            if (matchPos > parsedPos) {
                                matchIdx = i;
                                parsedPos = matchPos;
                            }
                        }
                        if (matchIdx >= 0) {
                            if (timeType) {
                                *timeType = getTimeType(tzdbNameMatches->getNameTypeAt(matchIdx));
                            }
                            pos.setIndex(matchPos);
                            getTimeZoneID(tzdbNameMatches.getAlias(), matchIdx, tzID);
                            U_ASSERT(!tzID.isEmpty());
                            return TimeZone::createTimeZone(tzID);
                        }
                    }
                }
            }
            break;
        }
    case UTZFMT_STYLE_GENERIC_LONG:
    case UTZFMT_STYLE_GENERIC_SHORT:
    case UTZFMT_STYLE_GENERIC_LOCATION:
        {
            int32_t genericNameTypes = 0;
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
                genericNameTypes = UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_LONG:
                genericNameTypes = UTZGNM_LONG | UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
                genericNameTypes = UTZGNM_SHORT | UTZGNM_LOCATION;
                break;

            default:
                U_ASSERT(FALSE);
            }

            int32_t len = 0;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;
            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                len = gnames->findBestMatch(text, startIdx, genericNameTypes, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (len > 0) {
                // Found a match
                if (timeType) {
                    *timeType = tt;
                }
                pos.setIndex(startIdx + len);
                U_ASSERT(!tzID.isEmpty());
                return TimeZone::createTimeZone(tzID);
            }

            break;
        }
    case UTZFMT_STYLE_ZONE_ID:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseExemplarLocation(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    }
    evaluated |= STYLE_PARSE_FLAGS[style];


    if (parsedPos > startIdx) {
        // When the specified style is one of SPECIFIC_XXX or GENERIC_XXX, we tried to parse the input
        // as localized GMT format earlier. If parsedOffset is positive, it means it was successfully
        // parsed as localized GMT format, but offset digits were not detected (more specifically, GMT
        // zero format). Then, it tried to find a match within the set of display names, but could not
        // find a match. At this point, we can safely assume the input text contains the localized
        // GMT format.
        U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
        pos.setIndex(parsedPos);
        return createTimeZoneForOffset(parsedOffset);
    }

    // Failed to parse the input text as the time zone format in the specified style.
    // Check the longest match among other styles below.
    UChar parsedIDBuf[32];
    UnicodeString parsedID(parsedIDBuf, 0, UPRV_LENGTHOF(parsedIDBuf));
    UTimeZoneFormatTimeType parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;

    U_ASSERT(parsedPos < 0);
    U_ASSERT(parsedOffset == UNKNOWN_OFFSET);

    // ISO 8601
    if (parsedPos < maxPos &&
        ((evaluated & ISO_Z_STYLE_FLAG) == 0 || (evaluated & ISO_LOCAL_STYLE_FLAG) == 0)) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Note: When ISO 8601 format contains offset digits, it should not
            // collide with other formats. However, ISO 8601 UTC format "Z" (single letter)
            // may collide with other names. In this case, we need to evaluate other names.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
                U_ASSERT(parsedPos == startIdx + 1);    // only when "Z" is used
            }
        }
    }

    // Localized GMT format
    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, TRUE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    // When ParseOption.ALL_STYLES is available, we also try to look all possible display names and IDs.
    // For example, when style is GENERIC_LONG, "EST" (SPECIFIC_SHORT) is never
    // used for America/New_York. With parseAllStyles true, this code parses "EST"
    // as America/New_York.

    // Note: Adding all possible names into the trie used by the implementation is quite heavy operation,
    // which we want to avoid normally (note that we cache the trie, so this is applicable to the
    // first time only as long as the cache does not expire).

    if (parseOptions & UTZFMT_PARSE_OPTION_ALL_STYLES) {
        // Try all specific names and exemplar location names
        if (parsedPos < maxPos) {
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            int32_t specificMatchIdx = -1;
            int32_t matchPos = -1;
            if (!specificMatches.isNull()) {
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    if (startIdx + specificMatches->getMatchLengthAt(i) > matchPos) {
                        specificMatchIdx = i;
                        matchPos = startIdx + specificMatches->getMatchLengthAt(i);
                    }
                }
            }
            if (parsedPos < matchPos) {
                U_ASSERT(specificMatchIdx >= 0);
                parsedPos = matchPos;
                getTimeZoneID(specificMatches.getAlias(), specificMatchIdx, parsedID);
                parsedTimeType = getTimeType(specificMatches->getNameTypeAt(specificMatchIdx));
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        if (parseTZDBAbbrev && parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_SPECIFIC_SHORT]) == 0) {
            const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
            if (U_SUCCESS(status)) {
                LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                    tzdbTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
                if (U_FAILURE(status)) {
                    pos.setErrorIndex(startIdx);
                    return NULL;
                }
                int32_t tzdbNameMatchIdx = -1;
                int32_t matchPos = -1;
                if (!tzdbNameMatches.isNull()) {
                    for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                        if (startIdx + tzdbNameMatches->getMatchLengthAt(i) > matchPos) {
                            tzdbNameMatchIdx = i;
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                        }
                    }
                }
                if (parsedPos < matchPos) {
                    U_ASSERT(tzdbNameMatchIdx >= 0);
                    parsedPos = matchPos;
                    getTimeZoneID(tzdbNameMatches.getAlias(), tzdbNameMatchIdx, parsedID);
                    parsedTimeType = getTimeType(tzdbNameMatches->getNameTypeAt(tzdbNameMatchIdx));
                    parsedOffset = UNKNOWN_OFFSET;
                }
            }
        }
        // Try generic names
        if (parsedPos < maxPos) {
            int32_t genMatchLen = -1;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;

            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                genMatchLen = gnames->findBestMatch(text, startIdx, ALL_GENERIC_NAME_TYPES, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }

            if (genMatchLen > 0 && parsedPos < startIdx + genMatchLen) {
                parsedPos = startIdx + genMatchLen;
                parsedID.setTo(tzID);
                parsedTimeType = tt;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }

        // Try time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        // Try short time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
    }

    if (parsedPos > startIdx) {
        // Parsed successfully
        TimeZone* parsedTZ;
        if (parsedID.length() > 0) {
            parsedTZ = TimeZone::createTimeZone(parsedID);
        } else {
            U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
            parsedTZ = createTimeZoneForOffset(parsedOffset);
        }
        if (timeType) {
            *timeType = parsedTimeType;
        }
        pos.setIndex(parsedPos);
        return parsedTZ;
    }

    pos.setErrorIndex(startIdx);
    return NULL;
}